

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::MapKeyDataOnlyByteSize(FieldDescriptor *field,MapKey *value)

{
  Type TVar1;
  CppType CVar2;
  CppType CVar3;
  uint32 value_00;
  int32 iVar4;
  uint64 value_01;
  int64 iVar5;
  string *value_02;
  LogMessage *pLVar6;
  LogFinisher local_e9;
  LogMessage local_e8;
  LogFinisher local_a9;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  MapKey *local_20;
  MapKey *value_local;
  FieldDescriptor *field_local;
  
  local_20 = value;
  value_local = (MapKey *)field;
  TVar1 = FieldDescriptor::type(field);
  CVar2 = FieldDescriptor::TypeToCppType(TVar1);
  CVar3 = MapKey::type(local_20);
  local_59 = 0;
  if (CVar2 != CVar3) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x4d5);
    local_59 = 1;
    pLVar6 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (FieldDescriptor::TypeToCppType(field->type())) == (value.type()): "
                       );
    LogFinisher::operator=(local_6d,pLVar6);
  }
  if ((local_59 & 1) != 0) {
    LogMessage::~LogMessage(&local_58);
  }
  TVar1 = FieldDescriptor::type((FieldDescriptor *)value_local);
  switch(TVar1) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x4dd);
    pLVar6 = LogMessage::operator<<(&local_a8,"Unsupported");
    LogFinisher::operator=(&local_a9,pLVar6);
    LogMessage::~LogMessage(&local_a8);
    field_local = (FieldDescriptor *)0x0;
    break;
  case TYPE_INT64:
    iVar5 = MapKey::GetInt64Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::Int64Size(iVar5);
    break;
  case TYPE_UINT64:
    value_01 = MapKey::GetUInt64Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::UInt64Size(value_01);
    break;
  case TYPE_INT32:
    iVar4 = MapKey::GetInt32Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::Int32Size(iVar4);
    break;
  case TYPE_FIXED64:
    field_local = (FieldDescriptor *)0x8;
    break;
  case TYPE_FIXED32:
    field_local = (FieldDescriptor *)0x4;
    break;
  case TYPE_BOOL:
    field_local = (FieldDescriptor *)0x1;
    break;
  case TYPE_STRING:
    value_02 = MapKey::GetStringValue_abi_cxx11_(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::StringSize(value_02);
    break;
  case TYPE_UINT32:
    value_00 = MapKey::GetUInt32Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::UInt32Size(value_00);
    break;
  case TYPE_SFIXED32:
    field_local = (FieldDescriptor *)0x4;
    break;
  case TYPE_SFIXED64:
    field_local = (FieldDescriptor *)0x8;
    break;
  case TYPE_SINT32:
    iVar4 = MapKey::GetInt32Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::SInt32Size(iVar4);
    break;
  case MAX_TYPE:
    iVar5 = MapKey::GetInt64Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::SInt64Size(iVar5);
    break;
  default:
    LogMessage::LogMessage
              (&local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x4f8);
    pLVar6 = LogMessage::operator<<(&local_e8,"Cannot get here");
    LogFinisher::operator=(&local_e9,pLVar6);
    LogMessage::~LogMessage(&local_e8);
    field_local = (FieldDescriptor *)0x0;
  }
  return (size_t)field_local;
}

Assistant:

static size_t MapKeyDataOnlyByteSize(const FieldDescriptor* field,
                                     const MapKey& value) {
  GOOGLE_DCHECK_EQ(FieldDescriptor::TypeToCppType(field->type()), value.type());
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}